

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow *under_this_window,ImGuiWindow *ignore_window)

{
  uint uVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *g;
  uint uVar3;
  ImGuiWindow *window;
  ulong uVar4;
  
  uVar1 = (GImGui->WindowsFocusOrder).Size;
  if (under_this_window != (ImGuiWindow *)0x0) {
    uVar4 = (ulong)uVar1;
    uVar3 = uVar1;
    do {
      uVar4 = uVar4 - 1;
      if ((int)uVar3 < 1) goto LAB_00111e63;
      uVar3 = uVar3 - 1;
    } while ((GImGui->WindowsFocusOrder).Data[uVar4 & 0xffffffff] != under_this_window);
    if (uVar3 != 0xffffffff) goto LAB_00111e65;
  }
LAB_00111e63:
  uVar3 = uVar1;
LAB_00111e65:
  if ((int)uVar3 < 1) {
    window = (ImGuiWindow *)0x0;
  }
  else {
    uVar4 = (ulong)uVar3 + 1;
    window = (ImGuiWindow *)0x0;
    do {
      if ((int)uVar1 < (int)uVar3) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                      ,0x4e6,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      pIVar2 = (GImGui->WindowsFocusOrder).Data[uVar4 - 2];
      if (((pIVar2 != ignore_window) && (pIVar2->WasActive == true)) &&
         ((~pIVar2->Flags & 0x40200U) != 0 && (pIVar2->Flags & 0x1000000U) == 0)) {
        window = pIVar2->NavLastChildNavWindow;
        if (pIVar2->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
          window = pIVar2;
        }
        break;
      }
      uVar4 = uVar4 - 1;
    } while (1 < uVar4);
  }
  FocusWindow(window);
  return;
}

Assistant:

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow* under_this_window, ImGuiWindow* ignore_window)
{
    ImGuiContext& g = *GImGui;

    int start_idx = g.WindowsFocusOrder.Size - 1;
    if (under_this_window != NULL)
    {
        int under_this_window_idx = FindWindowFocusIndex(under_this_window);
        if (under_this_window_idx != -1)
            start_idx = under_this_window_idx - 1;
    }
    for (int i = start_idx; i >= 0; i--)
    {
        // We may later decide to test for different NoXXXInputs based on the active navigation input (mouse vs nav) but that may feel more confusing to the user.
        ImGuiWindow* window = g.WindowsFocusOrder[i];
        if (window != ignore_window && window->WasActive && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            if ((window->Flags & (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs)) != (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs))
            {
                ImGuiWindow* focus_window = NavRestoreLastChildNavWindow(window);
                FocusWindow(focus_window);
                return;
            }
    }
    FocusWindow(NULL);
}